

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_compressed_base85
                    (nk_font_atlas *atlas,char *data_base85,float height,nk_font_config *config)

{
  char cVar1;
  nk_plugin_alloc p_Var2;
  int iVar3;
  int *compressed_data;
  int *piVar4;
  nk_font *pnVar5;
  nk_size compressed_size;
  
  if ((((data_base85 != (char *)0x0 && atlas != (nk_font_atlas *)0x0) &&
       (p_Var2 = (atlas->temporary).alloc, p_Var2 != (nk_plugin_alloc)0x0)) &&
      ((atlas->temporary).free != (nk_plugin_free)0x0)) &&
     (((atlas->permanent).alloc != (nk_plugin_alloc)0x0 &&
      ((atlas->permanent).free != (nk_plugin_free)0x0)))) {
    iVar3 = nk_strlen(data_base85);
    compressed_size = (nk_size)((iVar3 + 4) / 5 << 2);
    compressed_data = (int *)(*p_Var2)((atlas->temporary).userdata,(void *)0x0,compressed_size);
    piVar4 = compressed_data;
    if (compressed_data != (int *)0x0) {
      while( true ) {
        cVar1 = *data_base85;
        if (cVar1 == '\0') break;
        *piVar4 = (((((0x5b < data_base85[4] ^ 0xffffffdd) + (int)data_base85[4]) * 0x55 +
                    (0x5b < data_base85[3] ^ 0xffffffdd) + (int)data_base85[3]) * 0x55 +
                   (0x5b < data_base85[2] ^ 0xffffffdd) + (int)data_base85[2]) * 0x55 +
                  (0x5b < data_base85[1] ^ 0xffffffdd) + (int)data_base85[1]) * 0x55 +
                  ('[' < cVar1 ^ 0xffffffdd) + (int)cVar1;
        data_base85 = data_base85 + 5;
        piVar4 = piVar4 + 1;
      }
      pnVar5 = nk_font_atlas_add_compressed(atlas,compressed_data,compressed_size,height,config);
      (*(atlas->temporary).free)((atlas->temporary).userdata,compressed_data);
      return pnVar5;
    }
  }
  return (nk_font *)0x0;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed_base85(struct nk_font_atlas *atlas,
const char *data_base85, float height, const struct nk_font_config *config)
{
int compressed_size;
void *compressed_data;
struct nk_font *font;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

NK_ASSERT(data_base85);
if (!atlas || !data_base85 || !atlas->temporary.alloc || !atlas->temporary.free ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

compressed_size = (((int)nk_strlen(data_base85) + 4) / 5) * 4;
compressed_data = atlas->temporary.alloc(atlas->temporary.userdata,0, (nk_size)compressed_size);
NK_ASSERT(compressed_data);
if (!compressed_data) return 0;
nk_decode_85((unsigned char*)compressed_data, (const unsigned char*)data_base85);
font = nk_font_atlas_add_compressed(atlas, compressed_data,
(nk_size)compressed_size, height, config);
atlas->temporary.free(atlas->temporary.userdata, compressed_data);
return font;
}